

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O2

void If_ManImproveMapping(If_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  If_Obj_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  If_Obj_t *pObj;
  void *pvVar4;
  abctime aVar5;
  If_Cut_t *pCut;
  If_Obj_t *pObj_00;
  int iVar6;
  If_Man_t *pIVar7;
  ulong uVar8;
  int i;
  float fVar9;
  float fVar10;
  float fVar11;
  
  aVar3 = Abc_Clock();
  iVar6 = p->pPars->nLutSize;
  p_00 = (If_Obj_t *)Vec_PtrAlloc(iVar6);
  p_01 = Vec_PtrAlloc(iVar6);
  p_02 = Vec_PtrAlloc(100);
  i = 0;
  do {
    if (p->vObjs->nSize <= i) {
      Vec_PtrFree((Vec_Ptr_t *)p_00);
      Vec_PtrFree(p_01);
      Vec_PtrFree(p_02);
      pIVar7 = p;
      If_ManComputeRequired(p);
      iVar6 = (int)pIVar7;
      if (p->pPars->fVerbose != 0) {
        Abc_Print(iVar6,"E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ",(double)p->RequiredGlo,
                  (ulong)(uint)p->nNets);
        fVar9 = p->dPower;
        if ((fVar9 != 0.0) || (NAN(fVar9))) {
          Abc_Print(iVar6,"Switch = %7.2f.  ",(double)fVar9);
        }
        Abc_Print(iVar6,"Cut = %8d.  ",(ulong)(uint)p->nCutsMerged);
        aVar5 = Abc_Clock();
        Abc_Print(iVar6,"%s =","T");
        Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
        return;
      }
      return;
    }
    pObj = (If_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) {
      pCut = &pObj->CutBest;
      fVar9 = If_CutDelay(p,pObj,pCut);
      (pObj->CutBest).Delay = fVar9;
      if (pObj->Required + p->fEpsilon < fVar9) {
        __assert_fail("pCut->Delay <= pObj->Required + p->fEpsilon",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                      ,0x88,
                      "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      if (pObj->nRefs != 0) {
        fVar10 = If_CutAreaRefed(p,pCut);
        p_00->Id = 0;
        p_01->nSize = 0;
        p_02->nSize = 0;
        for (uVar8 = 0; uVar8 < (byte)(pObj->CutBest).field_0x1f; uVar8 = uVar8 + 1) {
          pvVar4 = Vec_PtrEntry(p->vObjs,*(int *)(&pObj[1].field_0x0 + uVar8 * 4));
          if (pvVar4 == (void *)0x0) break;
          Vec_PtrPush((Vec_Ptr_t *)p_00,pvVar4);
          Vec_PtrPush(p_01,pvVar4);
          Vec_PtrPush(p_02,pvVar4);
          *(byte *)((long)pvVar4 + 1) = *(byte *)((long)pvVar4 + 1) | 1;
        }
        If_ManImproveMark_rec(p,pObj,p_02);
        pIVar7 = p;
        If_CutAreaDeref(p,pCut);
        pObj_00 = p_00;
        iVar1 = If_ManImproveCutCost(pIVar7,(Vec_Ptr_t *)p_00);
        do {
          iVar2 = If_ManImproveNodeFaninCompact_int(pIVar7,pObj_00,iVar6,(Vec_Ptr_t *)p_00,p_02);
        } while (iVar2 != 0);
        iVar2 = If_ManImproveCutCost(pIVar7,(Vec_Ptr_t *)p_00);
        If_CutAreaRef(p,pCut);
        if (iVar1 < iVar2) {
          __assert_fail("CostBef >= CostAft",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                        ,0x99,
                        "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                       );
        }
        for (iVar1 = 0; iVar1 < p_02->nSize; iVar1 = iVar1 + 1) {
          pvVar4 = Vec_PtrEntry(p_02,iVar1);
          *(byte *)((long)pvVar4 + 1) = *(byte *)((long)pvVar4 + 1) & 0xfe;
        }
        If_ManImproveNodeUpdate(p,pObj,(Vec_Ptr_t *)p_00);
        fVar11 = If_CutDelay(p,pObj,pCut);
        (pObj->CutBest).Delay = fVar11;
        fVar11 = If_CutAreaRefed(p,pCut);
        if ((fVar10 < fVar11) || (pObj->Required + p->fEpsilon < (pObj->CutBest).Delay)) {
          If_ManImproveNodeUpdate(p,pObj,p_01);
          fVar11 = If_CutAreaRefed(p,pCut);
          if ((fVar11 != fVar10) || (NAN(fVar11) || NAN(fVar10))) {
            __assert_fail("AreaAft == AreaBef",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                          ,0xa6,
                          "void If_ManImproveNodeExpand(If_Man_t *, If_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          (pObj->CutBest).Delay = fVar9;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void If_ManImproveMapping( If_Man_t * p )
{
    abctime clk;

    clk = Abc_Clock();
    If_ManImproveExpand( p, p->pPars->nLutSize );
    If_ManComputeRequired( p );
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "E:  Del = %7.2f.  Ar = %9.1f.  Edge = %8d.  ", 
            p->RequiredGlo, p->AreaGlo, p->nNets );
        if ( p->dPower )
        Abc_Print( 1, "Switch = %7.2f.  ", p->dPower );
        Abc_Print( 1, "Cut = %8d.  ", p->nCutsMerged );
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }
}